

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::Option<Catch::SectionTracking::TestCaseTracker>::reset
          (Option<Catch::SectionTracking::TestCaseTracker> *this)

{
  Option<Catch::SectionTracking::TestCaseTracker> *this_local;
  
  if (this->nullableValue != (TestCaseTracker *)0x0) {
    SectionTracking::TestCaseTracker::~TestCaseTracker(this->nullableValue);
  }
  this->nullableValue = (TestCaseTracker *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = NULL;
        }